

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

bool __thiscall QPDFFormFieldObjectHelper::isCheckbox(QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  uint uVar2;
  bool local_51;
  string local_30;
  QPDFFormFieldObjectHelper *local_10;
  QPDFFormFieldObjectHelper *this_local;
  
  local_10 = this;
  getFieldType_abi_cxx11_(&local_30,this);
  bVar1 = std::operator==(&local_30,"/Btn");
  local_51 = false;
  if (bVar1) {
    uVar2 = getFlags(this);
    local_51 = (uVar2 & 0x18000) == 0;
  }
  std::__cxx11::string::~string((string *)&local_30);
  return local_51;
}

Assistant:

bool
QPDFFormFieldObjectHelper::isCheckbox()
{
    return ((getFieldType() == "/Btn") && ((getFlags() & (ff_btn_radio | ff_btn_pushbutton)) == 0));
}